

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O3

void __thiscall Spi::error(Spi *this,int status)

{
  check_rx(this);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"ABORT.",6);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  if (this->active == true) {
    this->active = false;
    FT_Close(this->ftHandle);
  }
  exit(status);
}

Assistant:

void Spi::error(int status) {
	check_rx();
	cerr << "ABORT." << endl;
	if (active)
		disconnect();
	exit(status);
}